

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O1

QString * __thiscall
QAccessibleMenuItem::text(QString *__return_storage_ptr__,QAccessibleMenuItem *this,Text t)

{
  int iVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  char cVar5;
  long in_FS_OFFSET;
  QKeySequence key;
  undefined1 *local_58;
  QString local_50;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (t != Accelerator) {
    if (t == Name) {
      QAction::text();
      qt_accStripAmp(&local_38,&local_50);
      pQVar2 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar3 = (__return_storage_ptr__->d).ptr;
      *(undefined4 *)&(__return_storage_ptr__->d).d = local_38.d.d._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_38.d.d._4_4_;
      *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_38.d.ptr._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_38.d.ptr._4_4_;
      qVar4 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_38.d.size;
      local_38.d.d = (Data *)pQVar2;
      local_38.d.ptr = pcVar3;
      local_38.d.size = qVar4;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    goto LAB_005238be;
  }
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QAction::shortcut();
  cVar5 = QKeySequence::isEmpty();
  if (cVar5 == '\0') {
    QKeySequence::toString((SequenceFormat)&local_38);
    local_50.d.d = (__return_storage_ptr__->d).d;
    pcVar3 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_38.d.d;
    (__return_storage_ptr__->d).ptr = local_38.d.ptr;
    qVar4 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_38.d.size;
    local_38.d.d = local_50.d.d;
    local_38.d.ptr = pcVar3;
    local_38.d.size = qVar4;
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      iVar1 = ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      goto joined_r0x005238a0;
    }
  }
  else {
    QAction::text();
    qt_accHotKey(&local_38,&local_50);
    pQVar2 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar3 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_38.d.d;
    (__return_storage_ptr__->d).ptr = local_38.d.ptr;
    qVar4 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_38.d.size;
    local_38.d.d = (Data *)pQVar2;
    local_38.d.ptr = pcVar3;
    local_38.d.size = qVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      iVar1 = ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
joined_r0x005238a0:
      if (iVar1 == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QKeySequence::~QKeySequence((QKeySequence *)&local_58);
LAB_005238be:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleMenuItem::text(QAccessible::Text t) const
{
    QString str;
    switch (t) {
    case QAccessible::Name:
        str = qt_accStripAmp(m_action->text());
        break;
    case QAccessible::Accelerator: {
#ifndef QT_NO_SHORTCUT
        QKeySequence key = m_action->shortcut();
        if (!key.isEmpty()) {
            str = key.toString();
        } else
#endif
        {
            str = qt_accHotKey(m_action->text());
        }
        break;
    }
    default:
        break;
    }
    return str;
}